

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall ClipperLib::ClipperOffset::Execute(ClipperOffset *this,Paths *solution,double delta)

{
  _List_node_base *p_Var1;
  iterator __position;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  pointer pIVar4;
  IntRect r;
  Path outer;
  Clipper clpr;
  IntRect local_188;
  Path local_168;
  undefined1 local_148 [136];
  ClipperBase local_c0;
  
  std::
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  ::_M_erase_at_end(solution,(solution->
                             super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start);
  FixOrientations(this);
  DoOffset(this,delta);
  local_c0.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_CurrentLM._M_current = (LocalMinimum *)0x0;
  local_c0.m_UseFullRange = false;
  local_148._0_8_ = &PTR_ExecuteInternal_00197c50;
  local_c0._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00197c98;
  p_Var1 = (_List_node_base *)(local_148 + 0x58);
  local_148._8_8_ = (pointer)0x0;
  local_148._16_8_ = (pointer)0x0;
  local_148._24_8_ = (pointer)0x0;
  local_148._32_8_ = (pointer)0x0;
  local_148._40_8_ = (pointer)0x0;
  local_148._48_8_ = (pointer)0x0;
  local_148._56_8_ = (pointer)0x0;
  local_148._64_8_ = (pointer)0x0;
  local_148._72_8_ = (pointer)0x0;
  local_148._104_8_ = 0;
  local_148[0x78] = false;
  local_148[0x84] = false;
  local_148[0x86] = false;
  local_c0.m_PreserveCollinear = false;
  local_c0.m_HasOpenPaths = false;
  local_148._88_8_ = p_Var1;
  local_148._96_8_ = p_Var1;
  ClipperBase::AddPaths(&local_c0,&this->m_destPolys,ptSubject,true);
  if (delta <= 0.0) {
    ClipperBase::GetBounds
              (&local_188,
               (ClipperBase *)(*(_func_int **)(local_148._0_8_ + -0x18) + (long)local_148));
    local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pIVar4 = (pointer)operator_new(0x40);
    local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_finish = pIVar4 + 4;
    pIVar4[3].X = 0;
    pIVar4[3].Y = 0;
    pIVar4[2].X = 0;
    pIVar4[2].Y = 0;
    pIVar4[1].X = 0;
    pIVar4[1].Y = 0;
    pIVar4->X = 0;
    pIVar4->Y = 0;
    pIVar4->X = local_188.left + -10;
    pIVar4->Y = local_188.bottom + 10;
    pIVar4[1].X = local_188.right + 10;
    pIVar4[1].Y = local_188.bottom + 10;
    pIVar4[2].X = local_188.right + 10;
    pIVar4[2].Y = local_188.top + -10;
    pIVar4[3].X = local_188.left + -10;
    pIVar4[3].Y = local_188.top + -10;
    local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_start = pIVar4;
    local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage =
         local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    ClipperBase::AddPath
              ((ClipperBase *)(local_148 + (long)*(_func_int **)(local_148._0_8_ + -0x18)),
               &local_168,ptSubject,true);
    local_148[0x84] = true;
    Clipper::Execute((Clipper *)local_148,ctUnion,solution,pftNegative,pftNegative);
    __position._M_current =
         (solution->
         super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
    if ((solution->
        super__Vector_base<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish != __position._M_current) {
      std::
      vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
      ::_M_erase(solution,__position);
    }
    operator_delete(pIVar4,0x40);
  }
  else {
    Clipper::Execute((Clipper *)local_148,ctUnion,solution,pftPositive,pftPositive);
  }
  local_148._0_8_ = &PTR_ExecuteInternal_00197c50;
  local_c0._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00197c98;
  p_Var3 = (_List_node_base *)local_148._88_8_;
  while (p_Var3 != p_Var1) {
    p_Var2 = p_Var3->_M_next;
    operator_delete(p_Var3,0x18);
    p_Var3 = p_Var2;
  }
  if ((pointer)local_148._56_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._56_8_,local_148._72_8_ - local_148._56_8_);
  }
  if ((pointer)local_148._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._32_8_,local_148._48_8_ - local_148._32_8_);
  }
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._8_8_,local_148._24_8_ - local_148._8_8_);
  }
  ClipperBase::~ClipperBase(&local_c0);
  return;
}

Assistant:

void ClipperOffset::Execute(Paths& solution, double delta)
{
  solution.clear();
  FixOrientations();
  DoOffset(delta);
  
  //now clean up 'corners' ...
  Clipper clpr;
  clpr.AddPaths(m_destPolys, ptSubject, true);
  if (delta > 0)
  {
    clpr.Execute(ctUnion, solution, pftPositive, pftPositive);
  }
  else
  {
    IntRect r = clpr.GetBounds();
    Path outer(4);
    outer[0] = IntPoint(r.left - 10, r.bottom + 10);
    outer[1] = IntPoint(r.right + 10, r.bottom + 10);
    outer[2] = IntPoint(r.right + 10, r.top - 10);
    outer[3] = IntPoint(r.left - 10, r.top - 10);

    clpr.AddPath(outer, ptSubject, true);
    clpr.ReverseSolution(true);
    clpr.Execute(ctUnion, solution, pftNegative, pftNegative);
    if (solution.size() > 0) solution.erase(solution.begin());
  }
}